

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prefilter.cc
# Opt level: O0

Rune re2::ToLowerRune(Rune r)

{
  CaseFold *f_00;
  CaseFold *f;
  Rune r_local;
  
  if (r < 0x80) {
    f._0_4_ = r;
    if ((0x40 < r) && (r < 0x5b)) {
      f._0_4_ = r + 0x20;
    }
    f._4_4_ = (Rune)f;
  }
  else {
    f_00 = LookupCaseFold((CaseFold *)unicode_tolower,0xb4,r);
    f._4_4_ = r;
    if ((f_00 != (CaseFold *)0x0) && (f_00->lo <= r)) {
      f._4_4_ = ApplyFold(f_00,r);
    }
  }
  return f._4_4_;
}

Assistant:

static Rune ToLowerRune(Rune r) {
  if (r < Runeself) {
    if ('A' <= r && r <= 'Z')
      r += 'a' - 'A';
    return r;
  }

  const CaseFold *f = LookupCaseFold(unicode_tolower, num_unicode_tolower, r);
  if (f == NULL || r < f->lo)
    return r;
  return ApplyFold(f, r);
}